

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O0

BuiltinFuncInfo *
deqp::gles3::Functional::BuiltinOperInfo
          (BuiltinFuncInfo *__return_storage_ptr__,char *caseName_,char *shaderFuncName_,
          ValueType outValue_,Value input0_,Value input1_,Value input2_,FloatScalar *resultScale_,
          FloatScalar *resultBias_,deUint32 precisionMask_,ShaderEvalFunc evalFuncScalar_,
          ShaderEvalFunc evalFuncVec2_,ShaderEvalFunc evalFuncVec3_,ShaderEvalFunc evalFuncVec4_)

{
  FloatScalar *resultBias__local;
  FloatScalar *resultScale__local;
  ValueType outValue__local;
  char *shaderFuncName__local;
  char *caseName__local;
  
  BuiltinFuncInfo::BuiltinFuncInfo
            (__return_storage_ptr__,caseName_,shaderFuncName_,outValue_,input0_,input1_,input2_,
             resultScale_,resultBias_,resultScale_,resultBias_,precisionMask_,evalFuncScalar_,
             evalFuncVec2_,evalFuncVec3_,evalFuncVec4_,OPERATOR,true);
  return __return_storage_ptr__;
}

Assistant:

static inline BuiltinFuncInfo BuiltinOperInfo (const char* caseName_, const char* shaderFuncName_, ValueType outValue_, Value input0_, Value input1_, Value input2_, const FloatScalar& resultScale_, const FloatScalar& resultBias_, deUint32 precisionMask_, ShaderEvalFunc evalFuncScalar_, ShaderEvalFunc evalFuncVec2_, ShaderEvalFunc evalFuncVec3_, ShaderEvalFunc evalFuncVec4_)
{
	return BuiltinFuncInfo(caseName_, shaderFuncName_, outValue_, input0_, input1_, input2_, resultScale_, resultBias_, resultScale_, resultBias_, precisionMask_, evalFuncScalar_, evalFuncVec2_, evalFuncVec3_, evalFuncVec4_, OPERATOR);
}